

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_address.cpp
# Opt level: O0

void __thiscall zmq::udp_address_t::udp_address_t(udp_address_t *this)

{
  undefined8 *in_RDI;
  undefined4 local_50;
  int in_stack_ffffffffffffffb4;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_24;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  *in_RDI = &PTR__udp_address_t_002c8e00;
  *(undefined4 *)((long)in_RDI + 0x24) = 0xffffffff;
  *(undefined1 *)((long)in_RDI + 0x44) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 9));
  ip_addr_t::any(in_stack_ffffffffffffffb4);
  *(ulong *)((long)in_RDI + 0x14) = CONCAT44(uStack_14,uStack_18);
  *(undefined8 *)((long)in_RDI + 0x1c) = uStack_10;
  in_RDI[1] = local_24;
  in_RDI[2] = CONCAT44(uStack_18,uStack_1c);
  ip_addr_t::any(in_stack_ffffffffffffffb4);
  in_RDI[5] = CONCAT44(in_stack_ffffffffffffffb4,local_50);
  in_RDI[6] = local_48;
  in_RDI[7] = local_40;
  *(undefined4 *)(in_RDI + 8) = local_38;
  return;
}

Assistant:

zmq::udp_address_t::udp_address_t () :
    _bind_interface (-1),
    _is_multicast (false)
{
    _bind_address = ip_addr_t::any (AF_INET);
    _target_address = ip_addr_t::any (AF_INET);
}